

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O2

void __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
::Consume::start_consume_impl
          (Consume *this,
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          *i_queue)

{
  uintptr_t *i_expected;
  ulong uVar1;
  bool bVar2;
  
  bVar2 = empty(this);
  if (!bVar2) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xf7);
  }
  begin_iteration(this,i_queue);
  i_expected = &this->m_next_ptr;
LAB_00f83014:
  do {
    bVar2 = empty(this);
    if (bVar2) {
      return;
    }
    uVar1 = *i_expected;
    if ((uVar1 & 0xb) == 0) {
      bVar2 = raw_atomic_compare_exchange_strong
                        (&this->m_control->m_next,i_expected,uVar1 | 1,memory_order_seq_cst,
                         memory_order_seq_cst);
      if (bVar2) {
        *(byte *)i_expected = (byte)*i_expected | 2;
        return;
      }
      bVar2 = empty(this);
      if (bVar2) {
        begin_iteration(this,i_queue);
        goto LAB_00f83014;
      }
    }
    else if (((uint)uVar1 & 3) == 2) {
      advance_head(this);
    }
    move_next(this);
  } while( true );
}

Assistant:

void start_consume_impl(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            /* We try to set the flag LfQueue_Busy on it */
                            if (raw_atomic_compare_exchange_strong(
                                  &m_control->m_next,
                                  &m_next_ptr,
                                  m_next_ptr | LfQueue_Busy,
                                  mem_acquire,
                                  mem_relaxed))
                            {
                                m_next_ptr |= LfQueue_Dead;
                                break;
                            }
                            else
                            {
                                if (empty())
                                {
                                    begin_iteration(i_queue);
                                    continue;
                                }
                            }
                        }
                        else if ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                        {
                            advance_head();
                        }
                        move_next();
                    }
                }